

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

double __thiscall
HighsDomain::adjustedUb(HighsDomain *this,HighsInt col,HighsCDouble boundVal,bool *accept)

{
  HighsVarType HVar1;
  const_reference pvVar2;
  pointer pHVar3;
  double *pdVar4;
  undefined1 *in_RDX;
  int in_ESI;
  long in_RDI;
  double dVar5;
  double dVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  HighsCDouble HVar9;
  double relativeImprove;
  double bound;
  undefined4 in_stack_ffffffffffffff48;
  HighsInt in_stack_ffffffffffffff4c;
  HighsMipSolver *in_stack_ffffffffffffff50;
  value_type vVar10;
  bool local_71;
  double local_68;
  value_type local_60;
  double local_58;
  double local_50;
  double local_48;
  HighsCDouble local_40;
  double local_30;
  undefined1 *local_28;
  int local_1c;
  HighsCDouble local_10;
  
  local_28 = in_RDX;
  local_1c = in_ESI;
  HVar1 = HighsMipSolver::variableType(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  if (HVar1 == kContinuous) {
    dVar6 = HighsCDouble::operator_cast_to_double(&local_10);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x308),(long)local_1c);
    dVar5 = *pvVar2;
    pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x5c1c67);
    if (pHVar3->epsilon < ABS(dVar6 - dVar5)) {
      local_30 = HighsCDouble::operator_cast_to_double(&local_10);
    }
    else {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x308),(long)local_1c
                         );
      local_30 = *pvVar2;
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 800),(long)local_1c);
    dVar5 = local_30;
    if ((*pvVar2 != INFINITY) || (NAN(*pvVar2))) {
      pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x5c1d1d);
      dVar6 = pHVar3->feastol;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 800),(long)local_1c);
      if (*pvVar2 <= dVar6 * 1000.0 + dVar5) {
        *local_28 = 0;
      }
      else {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 800),(long)local_1c
                           );
        local_58 = *pvVar2 - local_30;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x308),
                            (long)local_1c);
        if ((*pvVar2 != -INFINITY) || (NAN(*pvVar2))) {
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 800),
                              (long)local_1c);
          vVar10 = *pvVar2;
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x308),
                              (long)local_1c);
          local_58 = local_58 / (vVar10 - *pvVar2);
        }
        else {
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 800),
                              (long)local_1c);
          local_60 = ABS(*pvVar2);
          local_68 = ABS(local_30);
          pdVar4 = std::max<double>(&local_60,&local_68);
          local_58 = local_58 / *pdVar4;
        }
        *local_28 = 0.3 <= local_58;
      }
    }
    else {
      *local_28 = 1;
    }
  }
  else {
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x5c1ae0)
    ;
    HVar9 = HighsCDouble::operator+
                      ((HighsCDouble *)in_stack_ffffffffffffff50,
                       (double)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    uVar7 = HVar9.lo._0_4_;
    uVar8 = HVar9.lo._4_4_;
    local_50 = HVar9.hi;
    local_48 = HVar9.lo;
    local_40.hi = floor(local_50);
    local_40.lo = (double)CONCAT44(uVar8,uVar7);
    dVar5 = HighsCDouble::operator_cast_to_double(&local_40);
    local_30 = dVar5;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 800),(long)local_1c);
    local_71 = false;
    if (dVar5 < *pvVar2) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 800),(long)local_1c);
      dVar5 = *pvVar2 - local_30;
      pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x5c1bb6);
      local_71 = pHVar3->feastol * 1000.0 * ABS(local_30) < dVar5;
    }
    *local_28 = local_71;
  }
  return local_30;
}

Assistant:

double HighsDomain::adjustedUb(HighsInt col, HighsCDouble boundVal,
                               bool& accept) const {
  double bound;

  if (mipsolver->variableType(col) != HighsVarType::kContinuous) {
    bound = static_cast<double>(floor(boundVal + mipsolver->mipdata_->feastol));
    accept = bound < col_upper_[col] &&
             col_upper_[col] - bound >
                 1000.0 * mipsolver->mipdata_->feastol * std::fabs(bound);
  } else {
    if (std::fabs(double(boundVal) - col_lower_[col]) <=
        mipsolver->mipdata_->epsilon)
      bound = col_lower_[col];
    else
      bound = double(boundVal);
    if (col_upper_[col] == kHighsInf)
      accept = true;
    else if (bound + 1000.0 * mipsolver->mipdata_->feastol < col_upper_[col]) {
      double relativeImprove = col_upper_[col] - bound;
      if (col_lower_[col] != -kHighsInf)
        relativeImprove /= col_upper_[col] - col_lower_[col];
      else
        relativeImprove /=
            std::max(std::fabs(col_upper_[col]), std::fabs(bound));
      accept = relativeImprove >= 0.3;
    } else
      accept = false;
  }

  return bound;
}